

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

LY_ERR ly_set_merge(ly_set *trg,ly_set *src,ly_bool list,_func_void_ptr_void_ptr *duplicator)

{
  LY_ERR LVar1;
  lyd_node *plStack_40;
  LY_ERR ret__;
  void *obj;
  uint32_t u;
  _func_void_ptr_void_ptr *duplicator_local;
  ly_bool list_local;
  ly_set *src_local;
  ly_set *trg_local;
  
  if (trg == (ly_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","trg","ly_set_merge");
    trg_local._4_4_ = LY_EINVAL;
  }
  else if (src == (ly_set *)0x0) {
    trg_local._4_4_ = LY_SUCCESS;
  }
  else {
    for (obj._4_4_ = 0; obj._4_4_ < src->count; obj._4_4_ = obj._4_4_ + 1) {
      if (duplicator == (_func_void_ptr_void_ptr *)0x0) {
        plStack_40 = (src->field_2).dnodes[obj._4_4_];
      }
      else {
        plStack_40 = (lyd_node *)(*duplicator)((src->field_2).dnodes[obj._4_4_]);
      }
      LVar1 = ly_set_add(trg,plStack_40,list,(uint32_t *)0x0);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
    }
    trg_local._4_4_ = LY_SUCCESS;
  }
  return trg_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_set_merge(struct ly_set *trg, const struct ly_set *src, ly_bool list, void *(*duplicator)(const void *obj))
{
    uint32_t u;
    void *obj;

    LY_CHECK_ARG_RET(NULL, trg, LY_EINVAL);

    if (!src) {
        /* nothing to do */
        return LY_SUCCESS;
    }

    for (u = 0; u < src->count; ++u) {
        if (duplicator) {
            obj = duplicator(src->objs[u]);
        } else {
            obj = src->objs[u];
        }
        LY_CHECK_RET(ly_set_add(trg, obj, list, NULL));
    }

    return LY_SUCCESS;
}